

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O3

void __thiscall
QtMWidgets::NavigationBarPrivate::removeWidget(NavigationBarPrivate *this,QWidget *w)

{
  long lVar1;
  long *plVar2;
  Type *pTVar3;
  Data *dd;
  NavigationItem *pNVar4;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar5;
  long lVar6;
  qsizetype i;
  long lVar7;
  QVector<QSharedPointer<NavigationItem>_> tmp;
  QWidget *local_50;
  QArrayDataPointer<QSharedPointer<QtMWidgets::NavigationItem>_> local_48;
  
  local_50 = w;
  pQVar5 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&this->itemsMap,&local_50);
  pTVar3 = pQVar5->value;
  dd = pQVar5->d;
  if (dd != (Data *)0x0) {
    LOCK();
    (dd->weakref)._q_value.super___atomic_base<int>._M_i =
         (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (dd->strongref)._q_value.super___atomic_base<int>._M_i =
         (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::remove
            (&this->itemsMap,(char *)&local_50);
  QStackedWidget::removeWidget((QWidget *)this->stack);
  local_48.d = (pTVar3->children).d.d;
  pQVar5 = (pTVar3->children).d.ptr;
  local_48.size = (pTVar3->children).d.size;
  if (local_48.d != (Data *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48.ptr = pQVar5;
  if (local_48.size != 0) {
    lVar7 = local_48.size * 0x10;
    lVar6 = 0;
    do {
      removeWidget(this,*(QWidget **)(*(long *)((long)&pQVar5->value + lVar6) + 0x18));
      lVar6 = lVar6 + 0x10;
    } while (lVar7 != lVar6);
  }
  pNVar4 = pTVar3->parent;
  if (pNVar4 != (NavigationItem *)0x0) {
    lVar6 = (pNVar4->children).d.size;
    i = -1;
    if (0 < lVar6) {
      lVar7 = -0x10;
      do {
        if (lVar6 * -0x10 + lVar7 == -0x10) goto LAB_00169f71;
        lVar1 = lVar7 + 0x10;
        plVar2 = (long *)((long)&(pNVar4->children).d.ptr[1].value + lVar7);
        lVar7 = lVar1;
      } while ((Type *)*plVar2 != pTVar3);
      i = lVar1 >> 4;
    }
LAB_00169f71:
    QList<QSharedPointer<QtMWidgets::NavigationItem>_>::removeAt(&pNVar4->children,i);
  }
  QArrayDataPointer<QSharedPointer<QtMWidgets::NavigationItem>_>::~QArrayDataPointer(&local_48);
  QSharedPointer<QtMWidgets::NavigationItem>::deref(dd);
  return;
}

Assistant:

void
NavigationBarPrivate::removeWidget( QWidget * w )
{
	QSharedPointer< NavigationItem > item = itemsMap[ w ];

	itemsMap.remove( w );
	stack->removeWidget( w );

	const auto tmp = item->children;

	for( const auto & c : tmp )
		removeWidget( c->self );

	if( item->parent )
		item->parent->children.removeAt(
			item->parent->children.indexOf( item ) );
}